

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemInformation.cxx
# Opt level: O2

bool __thiscall
cmsys::SystemInformationImplementation::RetreiveInformationFromCpuInfoFile
          (SystemInformationImplementation *this)

{
  int *piVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  long lVar5;
  ostream *poVar6;
  ulonglong uVar7;
  uint uVar8;
  size_t index;
  ulong uVar9;
  bool bVar10;
  float fVar11;
  string cpuflags;
  string buffer;
  string cpurev;
  string familyStr;
  vector<const_char_*,_std::allocator<const_char_*>_> cachename;
  string CPUSpeed;
  string Cores;
  string idc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  string local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  string local_1c0;
  string local_1a0;
  string local_180;
  string local_160;
  string local_140;
  string local_120;
  string local_100;
  string local_e0;
  set<int,_std::less<int>,_std::allocator<int>_> PhysicalIDs;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  string local_70;
  string local_50;
  
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  buffer._M_dataplus._M_p = (pointer)&buffer.field_2;
  buffer._M_string_length = 0;
  buffer.field_2._M_local_buf[0] = '\0';
  __stream = fopen("/proc/cpuinfo","r");
  if (__stream == (FILE *)0x0) {
    poVar6 = std::operator<<((ostream *)&std::cout,"Problem opening /proc/cpuinfo");
    std::endl<char,std::char_traits<char>>(poVar6);
    goto LAB_002fa152;
  }
  while (iVar3 = feof(__stream), iVar3 == 0) {
    fgetc(__stream);
    std::__cxx11::string::push_back((char)&buffer);
  }
  fclose(__stream);
  std::__cxx11::string::resize((ulong)&buffer);
  while (lVar5 = std::__cxx11::string::find((char *)&buffer,0x4009f4), lVar5 != -1) {
    this->NumberOfLogicalCPU = this->NumberOfLogicalCPU + 1;
  }
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string((string *)&local_e0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&idc,this,&local_e0,"physical id",0);
  std::__cxx11::string::~string((string *)&local_e0);
  while (this->CurrentPositionInFile != 0xffffffffffffffff) {
    CPUSpeed._M_dataplus._M_p._0_4_ = atoi(idc._M_dataplus._M_p);
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &PhysicalIDs,(int *)&CPUSpeed);
    std::__cxx11::string::string((string *)&local_50,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&Cores,this,&local_50,"physical id",this->CurrentPositionInFile + 1)
    ;
    std::__cxx11::string::operator=((string *)&idc,(string *)&Cores);
    std::__cxx11::string::~string((string *)&Cores);
    std::__cxx11::string::~string((string *)&local_50);
  }
  bVar10 = PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count == 0;
  iVar3 = (int)PhysicalIDs._M_t._M_impl.super__Rb_tree_header._M_node_count;
  std::__cxx11::string::string((string *)&local_100,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&Cores,this,&local_100,"cpu cores",0);
  std::__cxx11::string::~string((string *)&local_100);
  iVar4 = atoi(Cores._M_dataplus._M_p);
  iVar3 = (iVar3 + (uint)bVar10) * (iVar4 + (uint)(iVar4 == 0));
  uVar8 = iVar3 + (uint)(iVar3 == 0);
  this->NumberOfPhysicalCPU = uVar8;
  (this->Features).ExtendedFeatures.LogicalProcessorsPerPhysical = this->NumberOfLogicalCPU / uVar8;
  std::__cxx11::string::string((string *)&local_120,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&CPUSpeed,this,&local_120,"cpu MHz",0);
  std::__cxx11::string::~string((string *)&local_120);
  if (CPUSpeed._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_140,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&familyStr,this,&local_140,"Cpu0ClkTck",0);
    std::__cxx11::string::operator=((string *)&CPUSpeed,(string *)&familyStr);
    std::__cxx11::string::~string((string *)&familyStr);
    std::__cxx11::string::~string((string *)&local_140);
    uVar7 = strtoull((char *)CONCAT44(CPUSpeed._M_dataplus._M_p._4_4_,(int)CPUSpeed._M_dataplus._M_p
                                     ),(char **)0x0,0x10);
    fVar11 = (float)uVar7 / 1e+06;
  }
  else {
    dVar2 = atof((char *)CONCAT44(CPUSpeed._M_dataplus._M_p._4_4_,(int)CPUSpeed._M_dataplus._M_p));
    fVar11 = (float)dVar2;
  }
  this->CPUSpeedInMHz = fVar11;
  std::__cxx11::string::string((string *)&local_160,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&familyStr,this,&local_160,"cpu family",0);
  std::__cxx11::string::~string((string *)&local_160);
  if (familyStr._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_180,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpurev,this,&local_180,"CPU architecture",0);
    std::__cxx11::string::operator=((string *)&familyStr,(string *)&cpurev);
    std::__cxx11::string::~string((string *)&cpurev);
    std::__cxx11::string::~string((string *)&local_180);
  }
  iVar3 = atoi(familyStr._M_dataplus._M_p);
  (this->ChipID).Family = iVar3;
  std::__cxx11::string::string((string *)&local_1a0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_1a0,"vendor_id",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).Vendor,(string *)&cpurev);
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&local_1a0);
  FindManufacturer(this,&familyStr);
  if (((this->ChipID).Family == 0) && (this->ChipManufacturer == HP)) {
    bVar10 = std::operator==(&familyStr,"PA-RISC 1.1a");
    iVar3 = 0x11a;
    if (!bVar10) {
      bVar10 = std::operator==(&familyStr,"PA-RISC 2.0");
      iVar3 = 0x200;
      if (!bVar10) goto LAB_002f9bf1;
    }
    (this->ChipID).Family = iVar3;
  }
LAB_002f9bf1:
  std::__cxx11::string::string((string *)&local_1c0,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_1c0,"model",0);
  iVar3 = atoi(cpurev._M_dataplus._M_p);
  (this->ChipID).Model = iVar3;
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&local_1c0);
  bVar10 = RetrieveClassicalCPUIdentity(this);
  if (!bVar10) {
    std::__cxx11::string::string((string *)&local_1e0,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpurev,this,&local_1e0,"cpu",0);
    std::__cxx11::string::~string((string *)&local_1e0);
    if (cpurev._M_string_length != 0) {
      std::__cxx11::string::_M_assign((string *)&(this->ChipID).ProcessorName);
    }
    std::__cxx11::string::~string((string *)&cpurev);
  }
  std::__cxx11::string::string((string *)&local_200,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpurev,this,&local_200,"stepping",0);
  std::__cxx11::string::~string((string *)&local_200);
  if (cpurev._M_string_length == 0) {
    std::__cxx11::string::string((string *)&local_220,(string *)&buffer);
    ExtractValueFromCpuInfoFile(&cpuflags,this,&local_220,"CPU revision",0);
    std::__cxx11::string::operator=((string *)&cpurev,(string *)&cpuflags);
    std::__cxx11::string::~string((string *)&cpuflags);
    std::__cxx11::string::~string((string *)&local_220);
  }
  iVar3 = atoi(cpurev._M_dataplus._M_p);
  (this->ChipID).Revision = iVar3;
  std::__cxx11::string::string((string *)&local_240,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpuflags,this,&local_240,"model name",0);
  std::__cxx11::string::operator=((string *)&(this->ChipID).ModelName,(string *)&cpuflags);
  std::__cxx11::string::~string((string *)&cpuflags);
  std::__cxx11::string::~string((string *)&local_240);
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  cpuflags._M_dataplus._M_p = "cache size";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  cpuflags._M_dataplus._M_p = "I-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  cpuflags._M_dataplus._M_p = "D-cache";
  std::vector<char_const*,std::allocator<char_const*>>::emplace_back<char_const*>
            ((vector<char_const*,std::allocator<char_const*>> *)&cachename,(char **)&cpuflags);
  (this->Features).L1CacheSize = 0;
  for (uVar9 = 0;
      uVar9 < (ulong)((long)cachename.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)cachename.
                            super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar9 = uVar9 + 1) {
    std::__cxx11::string::string((string *)&local_70,(string *)&buffer);
    ExtractValueFromCpuInfoFile
              (&cpuflags,this,&local_70,
               cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar9],0);
    std::__cxx11::string::~string((string *)&local_70);
    if (cpuflags._M_string_length != 0) {
      lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400aa7);
      if (lVar5 != -1) {
        std::__cxx11::string::substr((ulong)&local_90,(ulong)&cpuflags);
        std::__cxx11::string::operator=((string *)&cpuflags,(string *)&local_90);
        std::__cxx11::string::~string((string *)&local_90);
      }
      iVar3 = atoi(cpuflags._M_dataplus._M_p);
      piVar1 = &(this->Features).L1CacheSize;
      *piVar1 = *piVar1 + iVar3;
    }
    std::__cxx11::string::~string((string *)&cpuflags);
  }
  std::__cxx11::string::string((string *)&local_260,(string *)&buffer);
  ExtractValueFromCpuInfoFile(&cpuflags,this,&local_260,"flags",0);
  std::__cxx11::string::~string((string *)&local_260);
  if (cpurev._M_string_length != 0) {
    std::operator+(&local_280," ",&cpuflags);
    std::operator+(&local_90,&local_280," ");
    std::__cxx11::string::operator=((string *)&cpuflags,(string *)&local_90);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_280);
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400aab);
    if (lVar5 != -1) {
      (this->Features).HasFPU = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400ab1);
    if (lVar5 != -1) {
      (this->Features).HasTSC = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400ab7);
    if (lVar5 != -1) {
      (this->Features).HasMMX = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400abd);
    if (lVar5 != -1) {
      (this->Features).HasSSE = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400ac3);
    if (lVar5 != -1) {
      (this->Features).HasSSE2 = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400aca);
    if (lVar5 != -1) {
      (this->Features).HasAPIC = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400ad1);
    if (lVar5 != -1) {
      (this->Features).HasCMOV = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400ad8);
    if (lVar5 != -1) {
      (this->Features).HasMTRR = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400adf);
    if (lVar5 != -1) {
      (this->Features).HasACPI = true;
    }
    lVar5 = std::__cxx11::string::find((char *)&cpuflags,0x400ae6);
    if (lVar5 != -1) {
      (this->Features).ExtendedFeatures.Has3DNow = true;
    }
  }
  std::__cxx11::string::~string((string *)&cpuflags);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
            (&cachename.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
  std::__cxx11::string::~string((string *)&cpurev);
  std::__cxx11::string::~string((string *)&familyStr);
  std::__cxx11::string::~string((string *)&CPUSpeed);
  std::__cxx11::string::~string((string *)&Cores);
  std::__cxx11::string::~string((string *)&idc);
  std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
            (&PhysicalIDs._M_t);
LAB_002fa152:
  std::__cxx11::string::~string((string *)&buffer);
  return __stream != (FILE *)0x0;
}

Assistant:

bool SystemInformationImplementation::RetreiveInformationFromCpuInfoFile()
{
  this->NumberOfLogicalCPU = 0;
  this->NumberOfPhysicalCPU = 0;
  std::string buffer;

  FILE* fd = fopen("/proc/cpuinfo", "r");
  if (!fd) {
    std::cout << "Problem opening /proc/cpuinfo" << std::endl;
    return false;
  }

  size_t fileSize = 0;
  while (!feof(fd)) {
    buffer += static_cast<char>(fgetc(fd));
    fileSize++;
  }
  fclose(fd);
  buffer.resize(fileSize - 2);
  // Number of logical CPUs (combination of multiple processors, multi-core
  // and SMT)
  size_t pos = buffer.find("processor\t");
  while (pos != std::string::npos) {
    this->NumberOfLogicalCPU++;
    pos = buffer.find("processor\t", pos + 1);
  }

#ifdef __linux
  // Count sockets.
  std::set<int> PhysicalIDs;
  std::string idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id");
  while (this->CurrentPositionInFile != std::string::npos) {
    int id = atoi(idc.c_str());
    PhysicalIDs.insert(id);
    idc = this->ExtractValueFromCpuInfoFile(buffer, "physical id",
                                            this->CurrentPositionInFile + 1);
  }
  uint64_t NumberOfSockets = PhysicalIDs.size();
  NumberOfSockets = std::max(NumberOfSockets, (uint64_t)1);
  // Physical ids returned by Linux don't distinguish cores.
  // We want to record the total number of cores in this->NumberOfPhysicalCPU
  // (checking only the first proc)
  std::string Cores = this->ExtractValueFromCpuInfoFile(buffer, "cpu cores");
  unsigned int NumberOfCoresPerSocket = (unsigned int)atoi(Cores.c_str());
  NumberOfCoresPerSocket = std::max(NumberOfCoresPerSocket, 1u);
  this->NumberOfPhysicalCPU =
    NumberOfCoresPerSocket * (unsigned int)NumberOfSockets;

#else // __CYGWIN__
  // does not have "physical id" entries, neither "cpu cores"
  // this has to be fixed for hyper-threading.
  std::string cpucount =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu count");
  this->NumberOfPhysicalCPU = this->NumberOfLogicalCPU =
    atoi(cpucount.c_str());
#endif
  // gotta have one, and if this is 0 then we get a / by 0n
  // better to have a bad answer than a crash
  if (this->NumberOfPhysicalCPU <= 0) {
    this->NumberOfPhysicalCPU = 1;
  }
  // LogicalProcessorsPerPhysical>1 => SMT.
  this->Features.ExtendedFeatures.LogicalProcessorsPerPhysical =
    this->NumberOfLogicalCPU / this->NumberOfPhysicalCPU;

  // CPU speed (checking only the first processor)
  std::string CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "cpu MHz");
  if (!CPUSpeed.empty()) {
    this->CPUSpeedInMHz = static_cast<float>(atof(CPUSpeed.c_str()));
  }
#ifdef __linux
  else {
    // Linux Sparc: CPU speed is in Hz and encoded in hexadecimal
    CPUSpeed = this->ExtractValueFromCpuInfoFile(buffer, "Cpu0ClkTck");
    this->CPUSpeedInMHz =
      static_cast<float>(strtoull(CPUSpeed.c_str(), 0, 16)) / 1000000.0f;
  }
#endif

  // Chip family
  std::string familyStr =
    this->ExtractValueFromCpuInfoFile(buffer, "cpu family");
  if (familyStr.empty()) {
    familyStr = this->ExtractValueFromCpuInfoFile(buffer, "CPU architecture");
  }
  this->ChipID.Family = atoi(familyStr.c_str());

  // Chip Vendor
  this->ChipID.Vendor = this->ExtractValueFromCpuInfoFile(buffer, "vendor_id");
  this->FindManufacturer(familyStr);

  // second try for setting family
  if (this->ChipID.Family == 0 && this->ChipManufacturer == HP) {
    if (familyStr == "PA-RISC 1.1a")
      this->ChipID.Family = 0x11a;
    else if (familyStr == "PA-RISC 2.0")
      this->ChipID.Family = 0x200;
    // If you really get CMake to work on a machine not belonging to
    // any of those families I owe you a dinner if you get it to
    // contribute nightly builds regularly.
  }

  // Chip Model
  this->ChipID.Model =
    atoi(this->ExtractValueFromCpuInfoFile(buffer, "model").c_str());
  if (!this->RetrieveClassicalCPUIdentity()) {
    // Some platforms (e.g. PA-RISC) tell us their CPU name here.
    // Note: x86 does not.
    std::string cpuname = this->ExtractValueFromCpuInfoFile(buffer, "cpu");
    if (!cpuname.empty()) {
      this->ChipID.ProcessorName = cpuname;
    }
  }

  // Chip revision
  std::string cpurev = this->ExtractValueFromCpuInfoFile(buffer, "stepping");
  if (cpurev.empty()) {
    cpurev = this->ExtractValueFromCpuInfoFile(buffer, "CPU revision");
  }
  this->ChipID.Revision = atoi(cpurev.c_str());

  // Chip Model Name
  this->ChipID.ModelName =
    this->ExtractValueFromCpuInfoFile(buffer, "model name");

  // L1 Cache size
  // Different architectures may show different names for the caches.
  // Sum up everything we find.
  std::vector<const char*> cachename;
  cachename.clear();

  cachename.push_back("cache size"); // e.g. x86
  cachename.push_back("I-cache");    // e.g. PA-RISC
  cachename.push_back("D-cache");    // e.g. PA-RISC

  this->Features.L1CacheSize = 0;
  for (size_t index = 0; index < cachename.size(); index++) {
    std::string cacheSize =
      this->ExtractValueFromCpuInfoFile(buffer, cachename[index]);
    if (!cacheSize.empty()) {
      pos = cacheSize.find(" KB");
      if (pos != std::string::npos) {
        cacheSize = cacheSize.substr(0, pos);
      }
      this->Features.L1CacheSize += atoi(cacheSize.c_str());
    }
  }

  // processor feature flags (probably x86 specific)
  std::string cpuflags = this->ExtractValueFromCpuInfoFile(buffer, "flags");
  if (!cpurev.empty()) {
    // now we can match every flags as space + flag + space
    cpuflags = " " + cpuflags + " ";
    if ((cpuflags.find(" fpu ") != std::string::npos)) {
      this->Features.HasFPU = true;
    }
    if ((cpuflags.find(" tsc ") != std::string::npos)) {
      this->Features.HasTSC = true;
    }
    if ((cpuflags.find(" mmx ") != std::string::npos)) {
      this->Features.HasMMX = true;
    }
    if ((cpuflags.find(" sse ") != std::string::npos)) {
      this->Features.HasSSE = true;
    }
    if ((cpuflags.find(" sse2 ") != std::string::npos)) {
      this->Features.HasSSE2 = true;
    }
    if ((cpuflags.find(" apic ") != std::string::npos)) {
      this->Features.HasAPIC = true;
    }
    if ((cpuflags.find(" cmov ") != std::string::npos)) {
      this->Features.HasCMOV = true;
    }
    if ((cpuflags.find(" mtrr ") != std::string::npos)) {
      this->Features.HasMTRR = true;
    }
    if ((cpuflags.find(" acpi ") != std::string::npos)) {
      this->Features.HasACPI = true;
    }
    if ((cpuflags.find(" 3dnow ") != std::string::npos)) {
      this->Features.ExtendedFeatures.Has3DNow = true;
    }
  }

  return true;
}